

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::PolyOffsetBuilder::DoRound(PolyOffsetBuilder *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long64 lVar7;
  long64 lVar8;
  size_type sVar9;
  double dVar10;
  ulong local_60;
  size_type m;
  Polygon arc;
  double a2;
  double a1;
  IntPoint pt2;
  IntPoint pt1;
  PolyOffsetBuilder *this_local;
  
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  lVar7 = Round(pvVar6->X * this->m_delta + (double)lVar3);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  lVar8 = Round(pvVar6->Y * this->m_delta + (double)lVar3);
  IntPoint::IntPoint((IntPoint *)&pt2.Y,lVar7,lVar8);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  lVar7 = Round(pvVar6->X * this->m_delta + (double)lVar3);
  pvVar4 = std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::operator[](&this->m_p,this->m_i);
  pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     (pvVar4,this->m_j);
  lVar3 = pvVar5->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  lVar8 = Round(pvVar6->Y * this->m_delta + (double)lVar3);
  IntPoint::IntPoint((IntPoint *)&a1,lVar7,lVar8);
  AddPoint(this,(IntPoint *)&pt2.Y);
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  dVar1 = pvVar6->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  dVar10 = pvVar6->Y;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_j);
  dVar2 = pvVar6->X;
  pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
           operator[](&this->normals,this->m_k);
  if ((dVar1 * dVar10 + -(dVar2 * pvVar6->Y)) * this->m_delta < 0.0) {
    pvVar4 = std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::operator[](&this->m_p,this->m_i);
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (pvVar4,this->m_j);
    AddPoint(this,pvVar5);
  }
  else {
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    dVar1 = pvVar6->X;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    dVar10 = pvVar6->X;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_j);
    dVar2 = pvVar6->Y;
    pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
             operator[](&this->normals,this->m_k);
    if (dVar1 * dVar10 + dVar2 * pvVar6->Y < 0.985) {
      pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->normals,this->m_k);
      dVar1 = pvVar6->Y;
      pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->normals,this->m_k);
      dVar10 = atan2(dVar1,pvVar6->X);
      pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->normals,this->m_j);
      dVar1 = pvVar6->Y;
      pvVar6 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
               operator[](&this->normals,this->m_j);
      arc.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)atan2(dVar1,pvVar6->X);
      if ((this->m_delta <= 0.0) ||
         (dVar10 <= (double)arc.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
        if ((this->m_delta <= 0.0 && this->m_delta != 0.0) &&
           (dVar10 < (double)arc.
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
          arc.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((double)arc.
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        6.283185307179586);
        }
      }
      else {
        arc.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((double)arc.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      6.283185307179586);
      }
      pvVar4 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[](&this->m_p,this->m_i);
      pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                         (pvVar4,this->m_j);
      BuildArc((Polygon *)&m,pvVar5,dVar10,
               (double)arc.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_delta);
      for (local_60 = 0;
          sVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                             &m), local_60 < sVar9; local_60 = local_60 + 1) {
        pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                 operator[]((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                            &m,local_60);
        AddPoint(this,pvVar5);
      }
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&m);
    }
  }
  AddPoint(this,(IntPoint *)&a1);
  return;
}

Assistant:

void DoRound()
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    AddPoint(pt1);
    //round off reflex angles (ie > 180 deg) unless almost flat (ie < ~10deg).
    if ((normals[m_k].X*normals[m_j].Y - normals[m_j].X*normals[m_k].Y) * m_delta >= 0)
    {
      if (normals[m_j].X * normals[m_k].X + normals[m_j].Y * normals[m_k].Y < 0.985)
      {
        double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
        double a2 = std::atan2(normals[m_j].Y, normals[m_j].X);
        if (m_delta > 0 && a2 < a1) a2 += pi *2;
        else if (m_delta < 0 && a2 > a1) a2 -= pi *2;
        Polygon arc = BuildArc(m_p[m_i][m_j], a1, a2, m_delta);
        for (Polygon::size_type m = 0; m < arc.size(); m++)
          AddPoint(arc[m]);
      }
    }
    else
      AddPoint(m_p[m_i][m_j]);
    AddPoint(pt2);
}